

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

void __thiscall WildMidi_Renderer::ComputeOutput(WildMidi_Renderer *this,float *fbuffer,int len)

{
  void *pvVar1;
  int *piVar2;
  int *newbuf;
  int *buffer;
  _mdi *mdi;
  int len_local;
  float *fbuffer_local;
  WildMidi_Renderer *this_local;
  
  pvVar1 = this->handle;
  piVar2 = WM_Mix(this->handle,(int *)fbuffer,(long)len);
  newbuf = (int *)fbuffer;
  if ((*(ushort *)((long)pvVar1 + 0x30) & 4) != 0) {
    _WM_do_reverb(*(_rvb **)((long)pvVar1 + 0x50378),(int *)fbuffer,len << 1);
  }
  for (; newbuf < piVar2; newbuf = newbuf + 1) {
    *newbuf = (int)((float)*newbuf / 32768.0);
  }
  return;
}

Assistant:

void WildMidi_Renderer::ComputeOutput(float *fbuffer, int len)
{
	_mdi *mdi = (_mdi *)handle;
	int *buffer = (int *)fbuffer;
	int *newbuf = WM_Mix(handle, buffer, len);
//	assert(newbuf - buffer == len);
	if (mdi->info.mixer_options & WM_MO_REVERB) {
		_WM_do_reverb(mdi->reverb, buffer, len * 2);
	}
	for (; buffer < newbuf; ++buffer)
	{
		*(float *)buffer = (float)*buffer / 32768.f;
	}
}